

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

size_t prt_level_feeling(wchar_t row,wchar_t col)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  uint8_t attr;
  char *src;
  uint uVar4;
  char obj_feeling_str [6];
  char mon_feeling_str [6];
  char local_2c [6];
  char local_26 [6];
  
  if (((player->opts).opt[0x25] != true) || (player->depth == 0)) {
    return 0;
  }
  bVar1 = cave->feeling;
  uVar4 = bVar1 / 10;
  if (cave->feeling_squares < z_info->feeling_need) {
    my_strcpy(local_2c,"?",6);
    attr = '\x01';
  }
  else {
    attr = "\x01\n\f\x03\v\v\r\r\r\x0e\x0e"[uVar4];
    if (bVar1 < 10) {
      src = "*";
    }
    else {
      if (9 < bVar1 - 10) {
        strnfmt(local_2c,5,"%d",(ulong)(0xb - uVar4));
        goto LAB_001bddc5;
      }
      src = "$";
    }
    my_strcpy(local_2c,src,6);
  }
LAB_001bddc5:
  uVar4 = uVar4 * 0xfff6 + (uint)bVar1 & 0xffff;
  if (uVar4 == 0) {
    my_strcpy(local_26,"?",6);
  }
  else {
    strnfmt(local_26,5,"%d",(ulong)(10 - uVar4));
  }
  c_put_str('\x01',"LF:",row,col);
  c_put_str("\x01\x04\x03\x03\v\v\x05\x05\x06\x06"[uVar4],local_26,row,col + L'\x03');
  sVar3 = strlen(local_26);
  iVar2 = (int)sVar3;
  c_put_str('\x01',"-",row,col + iVar2 + L'\x03');
  c_put_str(attr,local_2c,row,col + iVar2 + L'\x04');
  sVar3 = strlen(local_2c);
  return (long)((int)sVar3 + iVar2 + 5);
}

Assistant:

static size_t prt_level_feeling(int row, int col)
{
	uint16_t obj_feeling;
	uint16_t mon_feeling;
	char obj_feeling_str[6];
	char mon_feeling_str[6];
	int new_col;
	uint8_t obj_feeling_color_print;

	/* Don't show feelings for cold-hearted characters */
	if (!OPT(player, birth_feelings)) return 0;

	/* No useful feeling in town */
	if (!player->depth) return 0;

	/* Get feelings */
	obj_feeling = cave->feeling / 10;
	mon_feeling = cave->feeling - (10 * obj_feeling);

	/*
	 *   Convert object feeling to a symbol easier to parse
	 * for a human.
	 *   0 -> * "Looks like any other level."
	 *   1 -> $ "you sense an item of wondrous power!" (special feeling)
	 *   2 to 10 are feelings from 2 meaning superb feeling to 10
	 * meaning naught but cobwebs.
	 *   It is easier for the player to have poor feelings as a
	 * low number and superb feelings as a higher one. So for
	 * display we reverse this numbers and subtract 1.
	 *   Thus (2-10) becomes (1-9 reversed)
	 *
	 *   But before that check if the player has explored enough
	 * to get a feeling. If not display as ?
	 */
	if (cave->feeling_squares < z_info->feeling_need) {
		my_strcpy(obj_feeling_str, "?", sizeof(obj_feeling_str));
		obj_feeling_color_print = COLOUR_WHITE;
	} else {
		obj_feeling_color_print = obj_feeling_color[obj_feeling];
		if (obj_feeling == 0)
			my_strcpy(obj_feeling_str, "*", sizeof(obj_feeling_str));
		else if (obj_feeling == 1)
			my_strcpy(obj_feeling_str, "$", sizeof(obj_feeling_str));
		else
			strnfmt(obj_feeling_str, 5, "%d", (unsigned int) (11-obj_feeling));
	}

	/* 
	 *   Convert monster feeling to a symbol easier to parse
	 * for a human.
	 *   0 -> ? . Monster feeling should never be 0, but we check
	 * it just in case.
	 *   1 to 9 are feelings from omens of death to quiet, paceful.
	 * We also reverse this so that what we show is a danger feeling.
	 */
	if (mon_feeling == 0)
		my_strcpy( mon_feeling_str, "?", sizeof(mon_feeling_str) );
	else
		strnfmt(mon_feeling_str, 5, "%d", (unsigned int) ( 10-mon_feeling ));

	/* Display it */
	c_put_str(COLOUR_WHITE, "LF:", row, col);
	new_col = col + 3;
	c_put_str(mon_feeling_color[mon_feeling], mon_feeling_str, row, new_col);
	new_col += strlen( mon_feeling_str );
	c_put_str(COLOUR_WHITE, "-", row, new_col);
	++new_col;
	c_put_str(obj_feeling_color_print, obj_feeling_str,	row, new_col);
	new_col += strlen( obj_feeling_str ) + 1;

	return new_col - col;
}